

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_layer.cpp
# Opt level: O2

void __thiscall neural_networks::utilities::NeuralLayer::print(NeuralLayer *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nData Vector: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1,"\n\n");
  (*(this->data->super_Matrix<neural_networks::utilities::Neuron_*>)._vptr_Matrix[5])();
  if (this->bias != (Matrix<long_double> *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"\nWeight Matrix: ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::operator<<(poVar1,"\n\n");
    (*this->weights->_vptr_Matrix[5])();
    poVar1 = std::operator<<((ostream *)&std::cout,"\nBias Vector: ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::operator<<(poVar1,"\n\n");
    (*this->bias->_vptr_Matrix[5])();
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void NeuralLayer::print() const {
    std::cout << "\nData Vector: " << data << "\n\n";
    data -> print();
    if(bias) {
        std::cout << "\nWeight Matrix: " << weights << "\n\n";
        weights -> print();
        std::cout << "\nBias Vector: " << bias << "\n\n";
        bias -> print();
    }
    std::cout << std::endl;
}